

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O3

void Fl_Tooltip::enter_area(Fl_Widget *wid,int x,int y,int w,int h,char *t)

{
  bool bVar1;
  code *pcVar2;
  double time;
  
  if (recursion != '\0') {
    return;
  }
  if (((t != (char *)0x0) && (*t != '\0')) && (bVar1 = Fl::option(OPTION_SHOW_TOOLTIPS), bVar1)) {
    if ((widget_ == wid) && (tip == t)) {
      return;
    }
    Fl::remove_timeout(tooltip_timeout,(void *)0x0);
    pcVar2 = recent_timeout;
    Fl::remove_timeout(recent_timeout,(void *)0x0);
    widget_ = wid;
    tip = t;
    ::Y = y;
    ::H = h;
    if (recent_tooltip == '\x01') {
      if (::window != (Fl_TooltipBox *)0x0) {
        (*(::window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
          super_Fl_Widget._vptr_Fl_Widget[6])();
      }
      time = (double)hoverdelay_;
    }
    else {
      time = (double)delay_;
      if (time < 0.1) {
        tooltip_timeout(pcVar2);
        return;
      }
      if ((::window != (Fl_TooltipBox *)0x0) &&
         (((::window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
           super_Fl_Widget.flags_ & 2) == 0)) {
        (*(::window->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
          super_Fl_Widget._vptr_Fl_Widget[6])();
        time = (double)delay_;
      }
    }
    Fl::add_timeout(time,tooltip_timeout,(void *)0x0);
    return;
  }
  exit_((Fl_Widget *)0x0);
  return;
}

Assistant:

void Fl_Tooltip::enter_area(Fl_Widget* wid, int x,int y,int w,int h, const char* t)
{
  (void)x;
  (void)w;

#ifdef DEBUG
  printf("Fl_Tooltip::enter_area(wid=%p, x=%d, y=%d, w=%d, h=%d, t=\"%s\")\n",
         wid, x, y, w, h, t ? t : "(null)");
  printf("    recursion=%d, window=%p\n", recursion, window);
#endif // DEBUG

  if (recursion) return;
  if (!t || !*t || !enabled()) {
    exit_(0);
    return;
  }
  // do nothing if it is the same:
  if (wid==widget_ /*&& x==X && y==Y && w==W && h==H*/ && t==tip) return;
  Fl::remove_timeout(tooltip_timeout);
  Fl::remove_timeout(recent_timeout);
  // remember it:
  widget_ = wid; Y = y; H = h; tip = t;
  // popup the tooltip immediately if it was recently up:
  if (recent_tooltip) {
    if (window) window->hide();
    Fl::add_timeout(Fl_Tooltip::hoverdelay(), tooltip_timeout);
  } else if (Fl_Tooltip::delay() < .1) {
#ifdef WIN32
    // possible fix for the Windows titlebar, it seems to want the
    // window to be destroyed, moving it messes up the parenting:
    if (window && window->visible()) window->hide();
#endif // WIN32
    tooltip_timeout(0);
  } else {
    if (window && window->visible()) window->hide();
    Fl::add_timeout(Fl_Tooltip::delay(), tooltip_timeout);
  }

#ifdef DEBUG
  printf("    tip=\"%s\", window->shown()=%d\n", tip ? tip : "(null)",
         window ? window->shown() : 0);
#endif // DEBUG
}